

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.h
# Opt level: O0

void __thiscall RtMidiError::RtMidiError(RtMidiError *this,string *message,Type type)

{
  Type type_local;
  string *message_local;
  RtMidiError *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__RtMidiError_00120d10;
  std::__cxx11::string::string((string *)&this->message_,(string *)message);
  this->type_ = type;
  return;
}

Assistant:

RtMidiError( const std::string& message, Type type = RtMidiError::UNSPECIFIED ) throw()
    : message_(message), type_(type) {}